

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O0

void __thiscall bitio::stream::stream(stream *this,FILE *file,uint64_t buffer_size)

{
  uint8_t *puVar1;
  size_t sVar2;
  uint64_t buffer_size_local;
  FILE *file_local;
  stream *this_local;
  
  this->_buffer = (uint8_t *)0x0;
  this->_buffer_offset = 0;
  this->_buffer_size = 0;
  this->_current_buffer_size = 0;
  this->_byte_head = 0;
  this->_bit_head = '\0';
  this->_file = (FILE *)0x0;
  this->_requires_commit = false;
  this->_reached_eof = false;
  this->_file = file;
  this->_buffer_size = buffer_size;
  puVar1 = (uint8_t *)operator_new__(buffer_size);
  this->_buffer = puVar1;
  sVar2 = fread(this->_buffer,1,buffer_size,(FILE *)file);
  this->_current_buffer_size = sVar2;
  return;
}

Assistant:

bitio::stream::stream(FILE *file, uint64_t buffer_size) {
    this->_file = file;
    this->_buffer_size = buffer_size;
    this->_buffer = new uint8_t [buffer_size];

    _current_buffer_size = std::fread(_buffer, 1, buffer_size, file);
}